

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testReEncode(void)

{
  int iVar1;
  int iVar2;
  TerritoryBoundary *b;
  int max_boundary;
  int min_boundary;
  ContextTestAround contexts [16];
  pthread_t threads [16];
  int local_20;
  int nrThread;
  int nrRecords;
  int m;
  Territory ccode;
  int nrTests;
  
  m = 0;
  printf("%d records\n",0x3fe4);
  nrRecords = 0x3e9;
  do {
    local_20 = 0;
    if (0x5fd < nrRecords) {
      return m;
    }
    nrThread = DATA_START[nrRecords + -0x3e9];
    iVar2 = DATA_START[nrRecords + -1000];
    showTestProgress(iVar2,0x3fe4,m);
    for (; nrThread < iVar2; nrThread = nrThread + 1) {
      (&max_boundary)[(long)local_20 * 4] = 0;
      *(TerritoryBoundary **)(contexts + local_20) = TERRITORY_BOUNDARIES + nrThread;
      iVar1 = pthread_create(threads + (long)local_20 + -1,(pthread_attr_t *)0x0,executeTestAround,
                             &max_boundary + (long)local_20 * 4);
      if (iVar1 != 0) {
        foundError();
        printf("*** ERROR *** Cannot create thread\n");
        return 0;
      }
      local_20 = local_20 + 1;
      if (0xf < local_20) {
        iVar1 = joinThreads((pthread_t *)&contexts[0xf].territoryBoundaries,
                            (ContextTestAround *)&max_boundary,local_20);
        m = iVar1 + m;
        local_20 = 0;
      }
    }
    iVar2 = joinThreads((pthread_t *)&contexts[0xf].territoryBoundaries,
                        (ContextTestAround *)&max_boundary,local_20);
    m = iVar2 + m;
    nrRecords = nrRecords + 1;
  } while( true );
}

Assistant:

static int testReEncode(void) {
    int nrTests = 0;
    enum Territory ccode;
    int m = 0;
    int nrRecords = MAPCODE_BOUNDARY_MAX;
    int nrThread = 0;

    // Declare threads and contexts.
    pthread_t threads[MAX_THREADS];
    struct ContextTestAround contexts[MAX_THREADS];

    printf("%d records\n", nrRecords);
    for (ccode = _TERRITORY_MIN + 1; ccode < _TERRITORY_MAX; ccode++) {
        int min_boundary = DATA_START[INDEX_OF_TERRITORY(ccode)];
        int max_boundary = DATA_START[INDEX_OF_TERRITORY(ccode) + 1];
        showTestProgress(max_boundary, nrRecords, nrTests);
        // use internal knowledge of mapcoder to test all the territory boundaries
        for (m = min_boundary; m < max_boundary; m++) {
            const TerritoryBoundary *b = TERRITORY_BOUNDARY(m);

            // Create context for thread.
            contexts[nrThread].nrTests = 0;
            contexts[nrThread].territoryBoundaries = b;

            // Execute task on new thread.
            if (pthread_create(&threads[nrThread], 0, executeTestAround, (void *) &contexts[nrThread])) {
                foundError();
                printf("*** ERROR *** Cannot create thread\n");
                return 0;
            }

            // Move to next thread in pool. If out of threads, join them and start over.
            nrThread++;
            if (nrThread >= MAX_THREADS) {
                nrTests += joinThreads(threads, contexts, nrThread);
                nrThread = 0;
            }
        }
        nrTests += joinThreads(threads, contexts, nrThread);
        nrThread = 0;
    }
    return nrTests;
}